

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_78::BinaryReaderIR::OnGlobalSymbol
          (BinaryReaderIR *this,Index index,uint32_t flags,string_view name,Index global_index)

{
  Module *pMVar1;
  bool bVar2;
  size_type sVar3;
  reference ppGVar4;
  string_view name_00;
  Binding local_b8;
  BinaryReaderIR *local_90;
  char *local_88;
  string local_80;
  undefined1 local_60 [8];
  string dollar_name;
  Global *glob;
  Index global_index_local;
  uint32_t flags_local;
  Index index_local;
  BinaryReaderIR *this_local;
  string_view name_local;
  
  name_local.data_ = (char *)name.size_;
  this_local = (BinaryReaderIR *)name.data_;
  bVar2 = string_view::empty((string_view *)&this_local);
  if (bVar2) {
    Result::Result((Result *)((long)&name_local.size_ + 4),Ok);
  }
  else {
    sVar3 = std::vector<wabt::Global_*,_std::allocator<wabt::Global_*>_>::size
                      (&this->module_->globals);
    if (global_index < sVar3) {
      ppGVar4 = std::vector<wabt::Global_*,_std::allocator<wabt::Global_*>_>::operator[]
                          (&this->module_->globals,(ulong)global_index);
      dollar_name.field_2._8_8_ = *ppGVar4;
      pMVar1 = this->module_;
      local_90 = this_local;
      local_88 = name_local.data_;
      name_00.size_ = dollar_name.field_2._8_8_;
      name_00.data_ = name_local.data_;
      (anonymous_namespace)::MakeDollarName_abi_cxx11_
                (&local_80,(_anonymous_namespace_ *)this_local,name_00);
      GetUniqueName((string *)local_60,this,&pMVar1->global_bindings,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::operator=((string *)dollar_name.field_2._8_8_,(string *)local_60);
      pMVar1 = this->module_;
      Binding::Binding(&local_b8,global_index);
      std::
      unordered_multimap<std::__cxx11::string,wabt::Binding,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>>
      ::emplace<std::__cxx11::string&,wabt::Binding>
                ((unordered_multimap<std::__cxx11::string,wabt::Binding,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>>
                  *)&pMVar1->global_bindings,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                 &local_b8);
      Result::Result((Result *)((long)&name_local.size_ + 4),Ok);
      std::__cxx11::string::~string((string *)local_60);
    }
    else {
      PrintError(this,"invalid global index: %u",(ulong)global_index);
      Result::Result((Result *)((long)&name_local.size_ + 4),Error);
    }
  }
  return (Result)name_local.size_._4_4_;
}

Assistant:

Result BinaryReaderIR::OnGlobalSymbol(Index index, uint32_t flags,
                                      string_view name, Index global_index) {
  if (name.empty()) {
    return Result::Ok;
  }
  if (global_index >= module_->globals.size()) {
    PrintError("invalid global index: %" PRIindex, global_index);
    return Result::Error;
  }
  Global* glob = module_->globals[global_index];
  std::string dollar_name =
      GetUniqueName(&module_->global_bindings, MakeDollarName(name));
  glob->name = dollar_name;
  module_->global_bindings.emplace(dollar_name, Binding(global_index));
  return Result::Ok;
}